

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printSwitch(JSPrinter *this,Ref node)

{
  Ref RVar1;
  undefined8 *puVar2;
  size_t *psVar3;
  Value *pVVar4;
  Ref *pRVar5;
  ulong uVar6;
  size_t sVar7;
  size_t curr;
  undefined8 local_38;
  Ref c;
  size_t i;
  Ref cases;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,"switch");
  space(this);
  emit(this,'(');
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  cases.inst = (Value *)*puVar2;
  print(this,cases);
  emit(this,')');
  space(this);
  emit(this,'{');
  newline(this);
  psVar3 = (size_t *)cashew::Ref::operator[]((uint)&this_local);
  i = *psVar3;
  c.inst = (Value *)0x0;
  while( true ) {
    RVar1.inst = c.inst;
    pVVar4 = Ref::operator->((Ref *)&i);
    pVVar4 = (Value *)Value::size(pVVar4);
    if (pVVar4 <= RVar1.inst) break;
    puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&i);
    local_38 = *puVar2;
    pRVar5 = (Ref *)cashew::Ref::operator[]((uint)&local_38);
    uVar6 = cashew::Ref::operator!(pRVar5);
    if ((uVar6 & 1) == 0) {
      emit(this,"case ");
      puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
      print(this,(Value *)*puVar2);
      emit(this,':');
    }
    else {
      emit(this,"default:");
    }
    pRVar5 = (Ref *)cashew::Ref::operator[]((uint)&local_38);
    pVVar4 = Ref::operator->(pRVar5);
    sVar7 = Value::size(pVVar4);
    if (sVar7 == 0) {
      newline(this);
    }
    else {
      this->indent = this->indent + 1;
      newline(this);
      sVar7 = this->used;
      puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_38);
      printStats(this,(Value *)*puVar2);
      this->indent = this->indent + -1;
      if (sVar7 == this->used) {
        this->used = this->used - 1;
      }
      else {
        newline(this);
      }
    }
    c.inst = (Value *)((long)&(c.inst)->type + 1);
  }
  emit(this,'}');
  return;
}

Assistant:

void printSwitch(Ref node) {
    emit("switch");
    space();
    emit('(');
    print(node[1]);
    emit(')');
    space();
    emit('{');
    newline();
    Ref cases = node[2];
    for (size_t i = 0; i < cases->size(); i++) {
      Ref c = cases[i];
      if (!c[0]) {
        emit("default:");
      } else {
        emit("case ");
        print(c[0]);
        emit(':');
      }
      if (c[1]->size() > 0) {
        indent++;
        newline();
        auto curr = used;
        printStats(c[1]);
        indent--;
        if (curr != used) {
          newline();
        } else {
          used--; // avoid the extra indentation we added tentatively
        }
      } else {
        newline();
      }
    }
    emit('}');
  }